

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O2

void __thiscall
google::protobuf::util::StatusOr<double>::StatusOr(StatusOr<double> *this,Status *status)

{
  undefined1 local_50 [40];
  StringPiece local_28;
  
  Status::Status(&this->status_);
  if (status->error_code_ == OK) {
    StringPiece::StringPiece(&local_28,"Status::OK is not a valid argument.");
    Status::Status((Status *)local_50,INTERNAL,local_28);
    Status::operator=(&this->status_,(Status *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  else {
    Status::operator=(&this->status_,status);
  }
  return;
}

Assistant:

inline StatusOr<T>::StatusOr(const Status& status) {
  if (status.ok()) {
    status_ = Status(error::INTERNAL, "Status::OK is not a valid argument.");
  } else {
    status_ = status;
  }
}